

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Flatten_x86::forward(Flatten_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long in_RCX;
  long *in_RDX;
  long *in_RSI;
  bool bVar10;
  int i_2;
  float *outptr;
  float *ptr_2;
  int q_1;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 _row3_1;
  __m128 _row2_1;
  __m128 _row1_1;
  __m128 _row0_1;
  int i_1;
  float *outptr3_1;
  float *outptr2_1;
  float *outptr1_1;
  float *outptr0_1;
  float *ptr_1;
  int q;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _row3;
  __m128 _row2;
  __m128 _row1;
  __m128 _row0;
  int j;
  float *outptr3;
  float *outptr2;
  float *outptr1;
  float *outptr0;
  float *ptr;
  int i;
  size_t out_elemsize;
  int out_elempack;
  int total;
  int size;
  int elempack;
  size_t elemsize;
  int channels;
  int d;
  int h;
  int w;
  int dims;
  int elembits;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffff740;
  undefined8 in_stack_fffffffffffff748;
  size_t in_stack_fffffffffffff750;
  undefined8 in_stack_fffffffffffff758;
  Mat *in_stack_fffffffffffff760;
  int local_854;
  int local_83c;
  undefined4 *local_838;
  Option *in_stack_fffffffffffff7e0;
  Mat *in_stack_fffffffffffff7e8;
  Mat *in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff7fc;
  undefined4 *local_7e8;
  int local_7dc;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  int local_754;
  undefined8 *local_750;
  undefined8 *local_748;
  undefined8 *local_740;
  undefined8 *local_738;
  undefined8 *local_6d8;
  int local_6cc;
  undefined4 in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff94c;
  undefined4 in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff954;
  undefined4 in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff95c;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  int local_644;
  undefined8 *local_640;
  undefined8 *local_638;
  undefined8 *local_630;
  undefined8 *local_628;
  undefined8 *local_620;
  int local_614;
  int local_608;
  int local_5b4;
  undefined4 local_4c8;
  undefined4 uStack_4c4;
  undefined4 local_4b8;
  undefined4 uStack_4b4;
  undefined4 local_4a8;
  undefined4 uStack_4a4;
  undefined4 local_498;
  undefined4 uStack_494;
  undefined4 local_488;
  undefined4 uStack_484;
  undefined4 local_478;
  undefined4 uStack_474;
  undefined4 local_468;
  undefined4 uStack_464;
  undefined4 local_458;
  undefined4 uStack_454;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  
  if ((int)in_RSI[3] == 0) {
    local_854 = 0;
  }
  else {
    local_854 = (int)((long)((ulong)(uint)((int)(in_RSI[2] << 3) >> 0x1f) << 0x20 |
                            in_RSI[2] << 3 & 0xffffffffU) / (long)(int)in_RSI[3]);
  }
  if (local_854 == 8) {
    local_5b4 = forward_int8((Flatten_x86 *)
                             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                             (Mat *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                             (Mat *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                             (Option *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948)
                            );
  }
  else {
    iVar1 = (int)in_RSI[5];
    if (iVar1 == 1) {
      if (in_RDX != in_RSI) {
        if (in_RSI[1] != 0) {
          LOCK();
          *(int *)in_RSI[1] = *(int *)in_RSI[1] + 1;
          UNLOCK();
        }
        if (in_RDX[1] != 0) {
          piVar5 = (int *)in_RDX[1];
          LOCK();
          iVar1 = *piVar5;
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (in_RDX[4] == 0) {
              if ((void *)*in_RDX != (void *)0x0) {
                free((void *)*in_RDX);
              }
            }
            else {
              (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
            }
          }
        }
        *in_RDX = 0;
        in_RDX[2] = 0;
        *(undefined4 *)(in_RDX + 3) = 0;
        *(undefined4 *)(in_RDX + 5) = 0;
        *(undefined4 *)((long)in_RDX + 0x2c) = 0;
        *(undefined4 *)(in_RDX + 6) = 0;
        *(undefined4 *)((long)in_RDX + 0x34) = 0;
        *(undefined4 *)(in_RDX + 7) = 0;
        in_RDX[8] = 0;
        in_RDX[1] = 0;
        *in_RDX = *in_RSI;
        in_RDX[1] = in_RSI[1];
        in_RDX[2] = in_RSI[2];
        *(int *)(in_RDX + 3) = (int)in_RSI[3];
        in_RDX[4] = in_RSI[4];
        *(int *)(in_RDX + 5) = (int)in_RSI[5];
        *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)in_RSI + 0x2c);
        *(int *)(in_RDX + 6) = (int)in_RSI[6];
        *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)in_RSI + 0x34);
        *(int *)(in_RDX + 7) = (int)in_RSI[7];
        in_RDX[8] = in_RSI[8];
      }
      local_5b4 = 0;
    }
    else {
      iVar2 = *(int *)((long)in_RSI + 0x2c);
      lVar7 = in_RSI[6];
      iVar3 = (int)in_RSI[7];
      uVar6 = in_RSI[2];
      iVar4 = (int)in_RSI[3];
      iVar8 = iVar2 * (int)lVar7 * *(int *)((long)in_RSI + 0x34);
      iVar9 = iVar8 * iVar3 * iVar4;
      local_608 = 1;
      if (((*(byte *)(in_RCX + 0x27) & 1) != 0) && (local_608 = 1, iVar9 % 4 == 0)) {
        local_608 = 4;
      }
      if (local_608 == 1) {
        local_5b4 = Flatten::forward((Flatten *)
                                     CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                                     in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                                     in_stack_fffffffffffff7e0);
      }
      else if ((iVar1 == 2) && (iVar4 == 1)) {
        if (in_RDX != in_RSI) {
          if (in_RSI[1] != 0) {
            LOCK();
            *(int *)in_RSI[1] = *(int *)in_RSI[1] + 1;
            UNLOCK();
          }
          if (in_RDX[1] != 0) {
            piVar5 = (int *)in_RDX[1];
            LOCK();
            iVar1 = *piVar5;
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (iVar1 == 1) {
              if (in_RDX[4] == 0) {
                if ((void *)*in_RDX != (void *)0x0) {
                  free((void *)*in_RDX);
                }
              }
              else {
                (**(code **)(*(long *)in_RDX[4] + 0x18))
                          ((long *)in_RDX[4],*in_RDX,uVar6 % (ulong)(long)iVar4);
              }
            }
          }
          *in_RDX = 0;
          in_RDX[2] = 0;
          *(undefined4 *)(in_RDX + 3) = 0;
          *(undefined4 *)(in_RDX + 5) = 0;
          *(undefined4 *)((long)in_RDX + 0x2c) = 0;
          *(undefined4 *)(in_RDX + 6) = 0;
          *(undefined4 *)((long)in_RDX + 0x34) = 0;
          *(undefined4 *)(in_RDX + 7) = 0;
          in_RDX[8] = 0;
          in_RDX[1] = 0;
          *in_RDX = *in_RSI;
          in_RDX[1] = in_RSI[1];
          in_RDX[2] = in_RSI[2];
          *(int *)(in_RDX + 3) = (int)in_RSI[3];
          in_RDX[4] = in_RSI[4];
          *(int *)(in_RDX + 5) = (int)in_RSI[5];
          *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)in_RSI + 0x2c);
          *(int *)(in_RDX + 6) = (int)in_RSI[6];
          *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)in_RSI + 0x34);
          *(int *)(in_RDX + 7) = (int)in_RSI[7];
          in_RDX[8] = in_RSI[8];
        }
        *(undefined4 *)(in_RDX + 5) = 1;
        *(int *)((long)in_RDX + 0x2c) = iVar9 / local_608;
        *(undefined4 *)(in_RDX + 6) = 1;
        in_RDX[8] = (long)*(int *)((long)in_RDX + 0x2c);
        in_RDX[2] = (uVar6 / (ulong)(long)iVar4) * (long)local_608;
        *(int *)(in_RDX + 3) = local_608;
        local_5b4 = 0;
      }
      else {
        Mat::create(in_stack_fffffffffffff760,(int)((ulong)in_stack_fffffffffffff758 >> 0x20),
                    in_stack_fffffffffffff750,(int)((ulong)in_stack_fffffffffffff748 >> 0x20),
                    in_stack_fffffffffffff740);
        bVar10 = true;
        if (*in_RDX != 0) {
          bVar10 = in_RDX[8] * (long)(int)in_RDX[7] == 0;
        }
        if (bVar10) {
          local_5b4 = -100;
        }
        else {
          if ((iVar1 == 2) && (iVar4 == 4)) {
            for (local_614 = 0; local_614 < (int)lVar7; local_614 = local_614 + 1) {
              local_620 = (undefined8 *)
                          (*in_RSI +
                          (long)*(int *)((long)in_RSI + 0x2c) * (long)local_614 * in_RSI[2]);
              local_628 = (undefined8 *)(*in_RDX + (long)(iVar2 * local_614 * 4) * 4);
              local_630 = (undefined8 *)(*in_RDX + (long)(iVar2 * (local_614 * 4 + 1)) * 4);
              local_638 = (undefined8 *)(*in_RDX + (long)(iVar2 * (local_614 * 4 + 2)) * 4);
              local_640 = (undefined8 *)(*in_RDX + (long)(iVar2 * (local_614 * 4 + 3)) * 4);
              for (local_644 = 0; local_644 + 3 < iVar2; local_644 = local_644 + 4) {
                local_458 = (undefined4)*local_620;
                uStack_454 = (undefined4)((ulong)*local_620 >> 0x20);
                local_468 = (undefined4)local_620[2];
                uStack_464 = (undefined4)((ulong)local_620[2] >> 0x20);
                local_478 = (undefined4)local_620[4];
                uStack_474 = (undefined4)((ulong)local_620[4] >> 0x20);
                local_488 = (undefined4)local_620[6];
                uStack_484 = (undefined4)((ulong)local_620[6] >> 0x20);
                uStack_3d0 = (undefined4)local_620[1];
                uStack_3cc = (undefined4)((ulong)local_620[1] >> 0x20);
                uStack_3e0 = (undefined4)local_620[3];
                uStack_3dc = (undefined4)((ulong)local_620[3] >> 0x20);
                uStack_3f0 = (undefined4)local_620[5];
                uStack_3ec = (undefined4)((ulong)local_620[5] >> 0x20);
                uStack_400 = (undefined4)local_620[7];
                uStack_3fc = (undefined4)((ulong)local_620[7] >> 0x20);
                local_658 = CONCAT44(local_468,local_458);
                uStack_650 = CONCAT44(local_488,local_478);
                local_668 = CONCAT44(uStack_464,uStack_454);
                uStack_660 = CONCAT44(uStack_484,uStack_474);
                local_678 = CONCAT44(uStack_3e0,uStack_3d0);
                uStack_670 = CONCAT44(uStack_400,uStack_3f0);
                local_688 = CONCAT44(uStack_3dc,uStack_3cc);
                uStack_680 = CONCAT44(uStack_3fc,uStack_3ec);
                *local_628 = local_658;
                local_628[1] = uStack_650;
                *local_630 = local_668;
                local_630[1] = uStack_660;
                *local_638 = local_678;
                local_638[1] = uStack_670;
                *local_640 = local_688;
                local_640[1] = uStack_680;
                local_620 = local_620 + 8;
                local_628 = local_628 + 2;
                local_630 = local_630 + 2;
                local_638 = local_638 + 2;
                local_640 = local_640 + 2;
              }
              for (; local_644 < iVar2; local_644 = local_644 + 1) {
                *(undefined4 *)local_628 = *(undefined4 *)local_620;
                *(undefined4 *)local_630 = *(undefined4 *)((long)local_620 + 4);
                *(undefined4 *)local_638 = *(undefined4 *)(local_620 + 1);
                *(undefined4 *)local_640 = *(undefined4 *)((long)local_620 + 0xc);
                local_620 = local_620 + 2;
                local_640 = (undefined8 *)((long)local_640 + 4);
                local_638 = (undefined8 *)((long)local_638 + 4);
                local_630 = (undefined8 *)((long)local_630 + 4);
                local_628 = (undefined8 *)((long)local_628 + 4);
              }
            }
          }
          if ((iVar1 == 3) || (iVar1 == 4)) {
            if (iVar4 == 4) {
              for (local_6cc = 0; local_6cc < iVar3; local_6cc = local_6cc + 1) {
                local_6d8 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_6cc * in_RSI[2]);
                local_738 = (undefined8 *)(*in_RDX + (long)(iVar8 * local_6cc * 4) * 4);
                local_740 = (undefined8 *)(*in_RDX + (long)(iVar8 * (local_6cc * 4 + 1)) * 4);
                local_748 = (undefined8 *)(*in_RDX + (long)(iVar8 * (local_6cc * 4 + 2)) * 4);
                local_750 = (undefined8 *)(*in_RDX + (long)(iVar8 * (local_6cc * 4 + 3)) * 4);
                for (local_754 = 0; local_754 + 3 < iVar8; local_754 = local_754 + 4) {
                  local_498 = (undefined4)*local_6d8;
                  uStack_494 = (undefined4)((ulong)*local_6d8 >> 0x20);
                  local_4a8 = (undefined4)local_6d8[2];
                  uStack_4a4 = (undefined4)((ulong)local_6d8[2] >> 0x20);
                  local_4b8 = (undefined4)local_6d8[4];
                  uStack_4b4 = (undefined4)((ulong)local_6d8[4] >> 0x20);
                  local_4c8 = (undefined4)local_6d8[6];
                  uStack_4c4 = (undefined4)((ulong)local_6d8[6] >> 0x20);
                  uStack_410 = (undefined4)local_6d8[1];
                  uStack_40c = (undefined4)((ulong)local_6d8[1] >> 0x20);
                  uStack_420 = (undefined4)local_6d8[3];
                  uStack_41c = (undefined4)((ulong)local_6d8[3] >> 0x20);
                  uStack_430 = (undefined4)local_6d8[5];
                  uStack_42c = (undefined4)((ulong)local_6d8[5] >> 0x20);
                  uStack_440 = (undefined4)local_6d8[7];
                  uStack_43c = (undefined4)((ulong)local_6d8[7] >> 0x20);
                  local_768 = CONCAT44(local_4a8,local_498);
                  uStack_760 = CONCAT44(local_4c8,local_4b8);
                  local_778 = CONCAT44(uStack_4a4,uStack_494);
                  uStack_770 = CONCAT44(uStack_4c4,uStack_4b4);
                  local_788 = CONCAT44(uStack_420,uStack_410);
                  uStack_780 = CONCAT44(uStack_440,uStack_430);
                  local_798 = CONCAT44(uStack_41c,uStack_40c);
                  uStack_790 = CONCAT44(uStack_43c,uStack_42c);
                  *local_738 = local_768;
                  local_738[1] = uStack_760;
                  *local_740 = local_778;
                  local_740[1] = uStack_770;
                  *local_748 = local_788;
                  local_748[1] = uStack_780;
                  *local_750 = local_798;
                  local_750[1] = uStack_790;
                  local_6d8 = local_6d8 + 8;
                  local_738 = local_738 + 2;
                  local_740 = local_740 + 2;
                  local_748 = local_748 + 2;
                  local_750 = local_750 + 2;
                }
                for (; local_754 < iVar8; local_754 = local_754 + 1) {
                  *(undefined4 *)local_738 = *(undefined4 *)local_6d8;
                  *(undefined4 *)local_740 = *(undefined4 *)((long)local_6d8 + 4);
                  *(undefined4 *)local_748 = *(undefined4 *)(local_6d8 + 1);
                  *(undefined4 *)local_750 = *(undefined4 *)((long)local_6d8 + 0xc);
                  local_6d8 = local_6d8 + 2;
                  local_750 = (undefined8 *)((long)local_750 + 4);
                  local_748 = (undefined8 *)((long)local_748 + 4);
                  local_740 = (undefined8 *)((long)local_740 + 4);
                  local_738 = (undefined8 *)((long)local_738 + 4);
                }
              }
            }
            if (iVar4 == 1) {
              for (local_7dc = 0; local_7dc < iVar3; local_7dc = local_7dc + 1) {
                local_838 = (undefined4 *)(*in_RDX + (long)(iVar8 * local_7dc) * 4);
                local_7e8 = (undefined4 *)(*in_RSI + in_RSI[8] * (long)local_7dc * in_RSI[2]);
                for (local_83c = 0; local_83c < iVar8; local_83c = local_83c + 1) {
                  *local_838 = *local_7e8;
                  local_838 = local_838 + 1;
                  local_7e8 = local_7e8 + 1;
                }
              }
            }
          }
          local_5b4 = 0;
        }
      }
    }
  }
  return local_5b4;
}

Assistant:

int Flatten_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h * d;

    int total = size * channels * elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = total % 16 == 0 ? 16 : total % 8 == 0 ? 8 : total % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = total % 8 == 0 ? 8 : total % 4 == 0 ? 4 : 1;
#else
        out_elempack = total % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    if (out_elempack == 1)
    {
        return Flatten::forward(bottom_blob, top_blob, opt);
    }

    if (dims == 2 && elempack == 1) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
    {
        top_blob = bottom_blob;
        top_blob.dims = 1;
        top_blob.w = total / out_elempack;
        top_blob.h = 1;
        top_blob.cstep = top_blob.w;
        top_blob.elemsize = out_elemsize;
        top_blob.elempack = out_elempack;
        return 0;
    }

    top_blob.create(total / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16) // out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 16;
                float* outptr1 = (float*)top_blob + w * (i * 16 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 16 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 16 + 3);
                float* outptr4 = (float*)top_blob + w * (i * 16 + 4);
                float* outptr5 = (float*)top_blob + w * (i * 16 + 5);
                float* outptr6 = (float*)top_blob + w * (i * 16 + 6);
                float* outptr7 = (float*)top_blob + w * (i * 16 + 7);
                float* outptr8 = (float*)top_blob + w * (i * 16 + 8);
                float* outptr9 = (float*)top_blob + w * (i * 16 + 9);
                float* outptra = (float*)top_blob + w * (i * 16 + 10);
                float* outptrb = (float*)top_blob + w * (i * 16 + 11);
                float* outptrc = (float*)top_blob + w * (i * 16 + 12);
                float* outptrd = (float*)top_blob + w * (i * 16 + 13);
                float* outptre = (float*)top_blob + w * (i * 16 + 14);
                float* outptrf = (float*)top_blob + w * (i * 16 + 15);

                int j = 0;
                for (; j + 15 < w; j += 16)
                {
                    __m512 _r0 = _mm512_loadu_ps(ptr);
                    __m512 _r1 = _mm512_loadu_ps(ptr + 16);
                    __m512 _r2 = _mm512_loadu_ps(ptr + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(ptr + 16 * 3);
                    __m512 _r4 = _mm512_loadu_ps(ptr + 16 * 4);
                    __m512 _r5 = _mm512_loadu_ps(ptr + 16 * 5);
                    __m512 _r6 = _mm512_loadu_ps(ptr + 16 * 6);
                    __m512 _r7 = _mm512_loadu_ps(ptr + 16 * 7);
                    __m512 _r8 = _mm512_loadu_ps(ptr + 16 * 8);
                    __m512 _r9 = _mm512_loadu_ps(ptr + 16 * 9);
                    __m512 _ra = _mm512_loadu_ps(ptr + 16 * 10);
                    __m512 _rb = _mm512_loadu_ps(ptr + 16 * 11);
                    __m512 _rc = _mm512_loadu_ps(ptr + 16 * 12);
                    __m512 _rd = _mm512_loadu_ps(ptr + 16 * 13);
                    __m512 _re = _mm512_loadu_ps(ptr + 16 * 14);
                    __m512 _rf = _mm512_loadu_ps(ptr + 16 * 15);

                    transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                    _mm512_storeu_ps(outptr0, _r0);
                    _mm512_storeu_ps(outptr1, _r1);
                    _mm512_storeu_ps(outptr2, _r2);
                    _mm512_storeu_ps(outptr3, _r3);
                    _mm512_storeu_ps(outptr4, _r4);
                    _mm512_storeu_ps(outptr5, _r5);
                    _mm512_storeu_ps(outptr6, _r6);
                    _mm512_storeu_ps(outptr7, _r7);
                    _mm512_storeu_ps(outptr8, _r8);
                    _mm512_storeu_ps(outptr9, _r9);
                    _mm512_storeu_ps(outptra, _ra);
                    _mm512_storeu_ps(outptrb, _rb);
                    _mm512_storeu_ps(outptrc, _rc);
                    _mm512_storeu_ps(outptrd, _rd);
                    _mm512_storeu_ps(outptre, _re);
                    _mm512_storeu_ps(outptrf, _rf);

                    outptr0 += 16;
                    outptr1 += 16;
                    outptr2 += 16;
                    outptr3 += 16;
                    outptr4 += 16;
                    outptr5 += 16;
                    outptr6 += 16;
                    outptr7 += 16;
                    outptr8 += 16;
                    outptr9 += 16;
                    outptra += 16;
                    outptrb += 16;
                    outptrc += 16;
                    outptrd += 16;
                    outptre += 16;
                    outptrf += 16;
                    ptr += 256;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];
                    *outptr8++ = ptr[8];
                    *outptr9++ = ptr[9];
                    *outptra++ = ptr[10];
                    *outptrb++ = ptr[11];
                    *outptrc++ = ptr[12];
                    *outptrd++ = ptr[13];
                    *outptre++ = ptr[14];
                    *outptrf++ = ptr[15];

                    ptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8) // out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 8;
                float* outptr1 = (float*)top_blob + w * (i * 8 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 8 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 8 + 3);
                float* outptr4 = (float*)top_blob + w * (i * 8 + 4);
                float* outptr5 = (float*)top_blob + w * (i * 8 + 5);
                float* outptr6 = (float*)top_blob + w * (i * 8 + 6);
                float* outptr7 = (float*)top_blob + w * (i * 8 + 7);

                int j = 0;
                for (; j + 7 < w; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 4;
                float* outptr1 = (float*)top_blob + w * (i * 4 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 4 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 4 + 3);

                int j = 0;
                for (; j + 3 < w; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (dims == 3 || dims == 4)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16) // out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 16;
                float* outptr1 = (float*)top_blob + size * (q * 16 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 16 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 16 + 3);
                float* outptr4 = (float*)top_blob + size * (q * 16 + 4);
                float* outptr5 = (float*)top_blob + size * (q * 16 + 5);
                float* outptr6 = (float*)top_blob + size * (q * 16 + 6);
                float* outptr7 = (float*)top_blob + size * (q * 16 + 7);
                float* outptr8 = (float*)top_blob + size * (q * 16 + 8);
                float* outptr9 = (float*)top_blob + size * (q * 16 + 9);
                float* outptra = (float*)top_blob + size * (q * 16 + 10);
                float* outptrb = (float*)top_blob + size * (q * 16 + 11);
                float* outptrc = (float*)top_blob + size * (q * 16 + 12);
                float* outptrd = (float*)top_blob + size * (q * 16 + 13);
                float* outptre = (float*)top_blob + size * (q * 16 + 14);
                float* outptrf = (float*)top_blob + size * (q * 16 + 15);

                int i = 0;
                for (; i + 15 < size; i += 16)
                {
                    __m512 _r0 = _mm512_loadu_ps(ptr);
                    __m512 _r1 = _mm512_loadu_ps(ptr + 16);
                    __m512 _r2 = _mm512_loadu_ps(ptr + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(ptr + 16 * 3);
                    __m512 _r4 = _mm512_loadu_ps(ptr + 16 * 4);
                    __m512 _r5 = _mm512_loadu_ps(ptr + 16 * 5);
                    __m512 _r6 = _mm512_loadu_ps(ptr + 16 * 6);
                    __m512 _r7 = _mm512_loadu_ps(ptr + 16 * 7);
                    __m512 _r8 = _mm512_loadu_ps(ptr + 16 * 8);
                    __m512 _r9 = _mm512_loadu_ps(ptr + 16 * 9);
                    __m512 _ra = _mm512_loadu_ps(ptr + 16 * 10);
                    __m512 _rb = _mm512_loadu_ps(ptr + 16 * 11);
                    __m512 _rc = _mm512_loadu_ps(ptr + 16 * 12);
                    __m512 _rd = _mm512_loadu_ps(ptr + 16 * 13);
                    __m512 _re = _mm512_loadu_ps(ptr + 16 * 14);
                    __m512 _rf = _mm512_loadu_ps(ptr + 16 * 15);

                    transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                    _mm512_storeu_ps(outptr0, _r0);
                    _mm512_storeu_ps(outptr1, _r1);
                    _mm512_storeu_ps(outptr2, _r2);
                    _mm512_storeu_ps(outptr3, _r3);
                    _mm512_storeu_ps(outptr4, _r4);
                    _mm512_storeu_ps(outptr5, _r5);
                    _mm512_storeu_ps(outptr6, _r6);
                    _mm512_storeu_ps(outptr7, _r7);
                    _mm512_storeu_ps(outptr8, _r8);
                    _mm512_storeu_ps(outptr9, _r9);
                    _mm512_storeu_ps(outptra, _ra);
                    _mm512_storeu_ps(outptrb, _rb);
                    _mm512_storeu_ps(outptrc, _rc);
                    _mm512_storeu_ps(outptrd, _rd);
                    _mm512_storeu_ps(outptre, _re);
                    _mm512_storeu_ps(outptrf, _rf);

                    outptr0 += 16;
                    outptr1 += 16;
                    outptr2 += 16;
                    outptr3 += 16;
                    outptr4 += 16;
                    outptr5 += 16;
                    outptr6 += 16;
                    outptr7 += 16;
                    outptr8 += 16;
                    outptr9 += 16;
                    outptra += 16;
                    outptrb += 16;
                    outptrc += 16;
                    outptrd += 16;
                    outptre += 16;
                    outptrf += 16;
                    ptr += 256;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];
                    *outptr8++ = ptr[8];
                    *outptr9++ = ptr[9];
                    *outptra++ = ptr[10];
                    *outptrb++ = ptr[11];
                    *outptrc++ = ptr[12];
                    *outptrd++ = ptr[13];
                    *outptre++ = ptr[14];
                    *outptrf++ = ptr[15];

                    ptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8) // out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 8;
                float* outptr1 = (float*)top_blob + size * (q * 8 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 8 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 8 + 3);
                float* outptr4 = (float*)top_blob + size * (q * 8 + 4);
                float* outptr5 = (float*)top_blob + size * (q * 8 + 5);
                float* outptr6 = (float*)top_blob + size * (q * 8 + 6);
                float* outptr7 = (float*)top_blob + size * (q * 8 + 7);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 4;
                float* outptr1 = (float*)top_blob + size * (q * 4 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 4 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 4 + 3);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = (float*)top_blob + size * q;

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}